

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::rowMoved(QTableView *this,int row,int oldIndex,int newIndex)

{
  long lVar1;
  QWidgetData *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this,CONCAT44(in_register_00000034,row));
  iVar4 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),oldIndex);
  iVar5 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),newIndex);
  if (*(long *)(lVar1 + 0x650) == lVar1 + 0x650) {
    iVar6 = QHeaderView::sectionViewportPosition
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar4);
    iVar7 = QHeaderView::sectionViewportPosition
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar5);
    iVar4 = QHeaderView::sectionSize
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar4);
    iVar5 = QHeaderView::sectionSize
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar5);
    local_48.y1.m_i = iVar7;
    if (iVar6 < iVar7) {
      local_48.y1.m_i = iVar6;
    }
    iVar3 = iVar5 + iVar7;
    if (iVar5 + iVar7 < iVar4 + iVar6) {
      iVar3 = iVar4 + iVar6;
    }
    pQVar2 = (*(QWidget **)(lVar1 + 0x2b0))->data;
    local_48.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    local_48.x1.m_i = 0;
    local_48.y2.m_i = iVar3 + -1;
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0),&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::rowMoved(int row, int oldIndex, int newIndex)
{
    Q_UNUSED(row);
    Q_D(QTableView);

    updateGeometries();
    int logicalOldIndex = d->verticalHeader->logicalIndex(oldIndex);
    int logicalNewIndex = d->verticalHeader->logicalIndex(newIndex);
    if (d->hasSpans()) {
        d->viewport->update();
    } else {
        int oldTop = rowViewportPosition(logicalOldIndex);
        int newTop = rowViewportPosition(logicalNewIndex);
        int oldBottom = oldTop + rowHeight(logicalOldIndex);
        int newBottom = newTop + rowHeight(logicalNewIndex);
        int top = qMin(oldTop, newTop);
        int bottom = qMax(oldBottom, newBottom);
        int height = bottom - top;
        d->viewport->update(0, top, d->viewport->width(), height);
    }
}